

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O1

void ansv<unsigned_long,0,2,1>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  void *pvVar1;
  pair<unsigned_long,_unsigned_long> *ppVar2;
  unsigned_long *puVar3;
  comm *comm_00;
  _Elt_pointer ppVar4;
  _Elt_pointer ppVar5;
  comm *pcVar6;
  _Map_pointer pppVar7;
  pair<unsigned_long,_unsigned_long> *ppVar8;
  _Elt_pointer ppVar9;
  _Elt_pointer ppVar10;
  unsigned_long uVar11;
  long lVar12;
  ulong uVar13;
  ulong *puVar14;
  unsigned_long uVar15;
  unsigned_long uVar16;
  pointer puVar17;
  pointer puVar18;
  _Elt_pointer ppVar19;
  int iVar20;
  int iVar21;
  _Elt_pointer ppVar22;
  _Map_pointer pppVar23;
  _Map_pointer pppVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  _Map_pointer pppVar29;
  _Elt_pointer ppVar30;
  ulong uVar31;
  bool bVar32;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_1d8;
  _Elt_pointer local_188;
  _Elt_pointer local_180;
  _Elt_pointer local_178;
  comm *local_170;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_168;
  _Elt_pointer local_160;
  _Elt_pointer local_158;
  size_type local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  _Map_pointer local_130;
  _Elt_pointer local_120;
  pair<unsigned_long,_unsigned_long> local_118;
  pointer local_108;
  pointer local_100;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  _Map_pointer local_80;
  unsigned_long local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_70;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_50;
  
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_168 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_108 = (pointer)nonsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_1d8,0);
  local_150 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  local_170 = comm;
  local_188 = (_Elt_pointer)mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_150,comm);
  lVar12 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar12 != 0) {
    lVar12 = lVar12 >> 3;
    lVar26 = (long)local_188 - 1;
LAB_0014061e:
    do {
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar12 + -1] < ppVar19[-1].first) {
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_0014061e;
        }
      }
      while (lVar25 = (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4,
            1 < ((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) + lVar25 +
                ((((ulong)((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
                          (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1
                 ) + (ulong)(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                            (_Map_pointer)0x0)) * 0x20) {
        ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        uVar16 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar12 + -1];
        if (uVar16 != ppVar19[-1].first) break;
        uVar31 = lVar25 - 1;
        if (uVar31 < 0x20) {
          ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          pppVar7 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppVar4 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
        }
        else {
          uVar13 = uVar31 >> 5 | 0xf800000000000000;
          if (1 < lVar25) {
            uVar13 = uVar31 >> 5;
          }
          pppVar7 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + uVar13;
          ppVar4 = *pppVar7;
          ppVar19 = ppVar4 + uVar31 + uVar13 * -0x20;
        }
        if (ppVar19 == ppVar4) {
          ppVar19 = pppVar7[-1] + 0x20;
        }
        if (uVar16 != ppVar19[-1].first) break;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(lVar26 + lVar12);
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar12 + -1];
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,(pair<unsigned_long,_unsigned_long> *)&local_148);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  local_50.current._M_cur = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_50.current._M_first = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_50.current._M_last = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_50.current._M_node = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_70.current._M_cur = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_70.current._M_first = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_70.current._M_last = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_70.current._M_node = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_148,&local_50,&local_70,(allocator_type *)&local_98);
  pvVar1 = *(void **)local_168;
  *(pointer *)local_168 =
       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_168 + 8) =
       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_168 + 0x10) =
       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  local_180 = (_Elt_pointer)in;
  if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar29 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar24 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_178 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_158 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar31 = ((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
           ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
           * 0x20;
  local_160 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  pppVar7 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar19 = local_180;
  if (uVar31 == 0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 0, right_type = 2, indexing_type = 1]"
                 );
  }
  for (; local_180 = ppVar19, pppVar7 < pppVar29; pppVar7 = pppVar7 + 1) {
    operator_delete(pppVar7[1]);
    ppVar19 = local_180;
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar24;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_158;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = local_160;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = local_178;
  if ((pointer)ppVar19->second !=
      (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar19->first)->_M_impl).
      super__Vector_impl_data._M_start) {
    uVar13 = 0;
LAB_00140963:
    do {
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar4 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar4 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if ((((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar19->first)->
            _M_impl).super__Vector_impl_data._M_start[uVar13] < ppVar4[-1].first) {
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_00140963;
        }
      }
      while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar4 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar4 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if ((((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar19->first)->
            _M_impl).super__Vector_impl_data._M_start[uVar13] != ppVar4[-1].first) break;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)((long)local_188 + uVar13);
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar19->first
                     )->_M_impl).super__Vector_impl_data._M_start[uVar13];
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,(pair<unsigned_long,_unsigned_long> *)&local_148);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)ppVar19->second -
                              (long)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *
                                      )&ppVar19->first)->_M_impl).super__Vector_impl_data._M_start
                             >> 3));
  }
  ppVar4 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar13 = (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar32 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0;
  local_188 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1d8._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1d8._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_130 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_178 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_80 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_168,*(undefined8 *)(local_168 + 8));
  pppVar24 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar12 = (long)ppVar4 - (long)local_178;
  local_178 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_100 = (pointer)(local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar12 = ((long)ppVar19 - (long)local_188 >> 4) + (lVar12 >> 4) +
           (((uVar13 >> 3) - 1) + (ulong)bVar32) * 0x20;
  ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar4 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar10 = (_Elt_pointer)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  pppVar7 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  pcVar6 = local_170;
  if (lVar12 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 0, right_type = 2, indexing_type = 1]"
                 );
  }
  for (; local_188 = ppVar10, local_160 = ppVar4, local_158 = ppVar19, local_170 = pcVar6,
      pppVar7 < pppVar24; pppVar7 = pppVar7 + 1) {
    operator_delete(pppVar7[1]);
    ppVar19 = local_158;
    ppVar4 = local_160;
    ppVar10 = local_188;
    pcVar6 = local_170;
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_178;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = local_158;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = local_160;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)local_188;
  if (lVar12 + uVar31 != *(long *)(local_168 + 8) - *(long *)local_168 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 0, right_type = 2, indexing_type = 1]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_148,(unsigned_long *)&local_100,1,pcVar6);
  local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_98,(long)pcVar6->m_size,(value_type_conflict *)&local_b0,
             (allocator_type *)&local_e0);
  local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b0,(long)pcVar6->m_size,(value_type_conflict *)&local_e0,
             (allocator_type *)&local_c8);
  comm_00 = local_170;
  iVar21 = pcVar6->m_rank;
  lVar12 = (long)iVar21;
  if (0 < lVar12) {
    ppVar8 = *(pair<unsigned_long,_unsigned_long> **)
              ((long)local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar12 * 8 + -8);
    local_188 = *(_Elt_pointer *)local_168;
    local_178 = (_Elt_pointer)
                local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    uVar16 = 0;
    lVar26 = lVar12;
    do {
      uVar11 = uVar16;
      if (((lVar26 < lVar12) && (uVar16 != 0)) &&
         (uVar11 = uVar16 - 1, ppVar8 < *(_Map_pointer)((long)local_188 + (uVar16 - 1) * 2 * 8))) {
        uVar11 = uVar16;
      }
      lVar25 = lVar26 + -1;
      uVar13 = uVar16 + 1;
      if (uVar16 + 1 < uVar31) {
        uVar13 = uVar31;
      }
      puVar14 = (ulong *)(uVar16 * 0x10 + *(long *)local_168);
      uVar15 = uVar16 - 1;
      do {
        uVar16 = uVar13 - 1;
        if (uVar15 + (1 - uVar13) == -1) break;
        puVar17 = (pointer)*puVar14;
        uVar16 = uVar15 + 1;
        puVar14 = puVar14 + 2;
        uVar15 = uVar16;
      } while (*(pointer *)
                ((long)local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar25 * 8) <= puVar17);
      ppVar2 = *(pair<unsigned_long,_unsigned_long> **)
                ((long)local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar25 * 8);
      iVar20 = 0x12;
      if (ppVar2 <= ppVar8) {
        *(pointer *)
         ((long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar25 * 8) = (pointer)((uVar16 - uVar11) + 1);
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar25] = uVar11;
        iVar20 = (uint)(*(pointer *)
                         ((long)local_148.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar25 * 8) < local_100)
                 << 4;
        ppVar8 = ppVar2;
      }
    } while (((iVar20 == 0x12) || (iVar20 == 0)) && (bVar32 = 1 < lVar26, lVar26 = lVar25, bVar32));
  }
  iVar20 = local_170->m_size;
  if ((iVar21 < iVar20 + -1) && (iVar21 + 1 < iVar20)) {
    lVar26 = *(long *)local_168;
    puVar17 = ((pointer *)
              ((long)local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start + 8))[lVar12];
    lVar12 = lVar12 + 1;
    uVar13 = (*(long *)(local_168 + 8) - lVar26 >> 4) - 1;
    do {
      uVar28 = uVar13;
      if (uVar31 < uVar13) {
        puVar14 = (ulong *)(uVar13 * 0x10 + lVar26);
        uVar27 = uVar13;
        do {
          uVar28 = uVar27;
          if ((pointer)*puVar14 <
              ((pointer *)
              local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start)[lVar12]) break;
          uVar27 = uVar27 - 1;
          puVar14 = puVar14 + -2;
          uVar28 = uVar31;
        } while (uVar31 < uVar27);
      }
      puVar18 = ((pointer *)
                local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start)[lVar12];
      iVar21 = 0x17;
      if (puVar18 <= puVar17) {
        ((pointer *)
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start)[lVar12] = (pointer)((uVar13 - uVar28) + 1);
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar12] = uVar28;
        iVar21 = 0;
        puVar17 = puVar18;
        if (((pointer *)
            local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start)[lVar12] < local_100) {
          iVar21 = 0x15;
        }
      }
    } while (((iVar21 == 0x17) || (iVar21 == 0)) &&
            (lVar12 = lVar12 + 1, uVar13 = uVar28, iVar20 != (int)lVar12));
  }
  mxx::all2all<unsigned_long>(&local_e0,&local_98,local_170);
  mxx::impl::get_displacements<unsigned_long>(&local_c8,&local_e0);
  uVar16 = local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  uVar11 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  ppVar19 = (_Elt_pointer)(uVar16 + uVar11);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_f8,(size_type)ppVar19,(allocator_type *)&local_118);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_168,&local_98,&local_b0,
             local_f8.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_e0,&local_c8,comm_00);
  local_188 = (_Elt_pointer)
              local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[comm_00->m_rank];
  local_160 = (_Elt_pointer)uVar11;
  local_158 = (_Elt_pointer)uVar16;
  local_120 = ppVar19;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(left_nsv,local_150);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(right_nsv,local_150);
  pppVar29 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar24 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_178 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_170 = (comm *)local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  for (pppVar7 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node; pppVar7 < pppVar29;
      pppVar7 = pppVar7 + 1) {
    operator_delete(pppVar7[1]);
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar19;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar24;
  lVar12 = (long)local_180->second -
           (long)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180->first)
                 ->_M_impl).super__Vector_impl_data._M_start;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_178;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)local_170;
  if (lVar12 != 0) {
    puVar17 = (pointer)(lVar12 >> 3);
    do {
      puVar17 = (pointer)((long)puVar17 - 1);
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        puVar18 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180->first
                   )->_M_impl).super__Vector_impl_data._M_start;
        do {
          ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          if (ppVar19[-1].first <= puVar18[(long)puVar17]) break;
          ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar19[-1].second] = (unsigned_long)puVar17;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      local_118.first =
           (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180->first)->
           _M_impl).super__Vector_impl_data._M_start[(long)puVar17];
      local_118.second = (unsigned_long)puVar17;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,&local_118);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_118.first;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = (unsigned_long)puVar17
        ;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (puVar17 != (pointer)0x0);
  }
  if (local_188 != (_Elt_pointer)0x0) {
    ppVar19 = (_Elt_pointer)0x0;
    do {
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      lVar12 = (long)&local_188->first + ~(ulong)ppVar19;
      ppVar8 = local_f8.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar12;
      uVar16 = lVar12 + local_150;
      do {
        ppVar4 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar4 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if (ppVar4[-1].first <= ppVar8->first) break;
        ppVar4 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar4 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[ppVar4[-1].second] = uVar16;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      } while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
      ppVar19 = (_Elt_pointer)((long)&ppVar19->first + 1);
    } while (ppVar19 != local_188);
  }
  pppVar29 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar24 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar4 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_178 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_first;
  pppVar7 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar19 = local_180;
  if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar17 = (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
    pppVar23 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
    do {
      if (ppVar5 == ppVar9) {
        ppVar9 = pppVar23[-1];
        pppVar23 = pppVar23 + -1;
        puVar17[ppVar9[0x1f].second] = (unsigned_long)local_108;
        ppVar5 = ppVar9 + 0x20;
      }
      else {
        puVar17[ppVar5[-1].second] = (unsigned_long)local_108;
      }
      ppVar5 = ppVar5 + -1;
    } while (ppVar5 != local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  for (; local_180 = ppVar19, pppVar7 < pppVar29; pppVar7 = pppVar7 + 1) {
    operator_delete(pppVar7[1]);
    ppVar19 = local_180;
  }
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar4;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar10;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar24;
  puVar17 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar19->first)->
            _M_impl).super__Vector_impl_data._M_start;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = local_178;
  if ((pointer)ppVar19->second != puVar17) {
    puVar18 = (pointer)0x0;
    do {
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          ppVar4 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar4 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          if (ppVar4[-1].first <= puVar17[(long)puVar18]) break;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar8 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar8[0x1f].second] = (unsigned_long)puVar18;
            ppVar19 = ppVar8 + 0x20;
          }
          else {
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] =
                 (unsigned_long)puVar18;
            ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar16 = ppVar19[-1].first;
          uVar11 = ppVar19[-1].second;
          while( true ) {
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
            ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            if (uVar16 != ppVar19[-1].first) break;
            ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar19[-1].second] = uVar11;
          }
          ppVar19 = local_180;
        } while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      local_118.first =
           (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar19->first)->
           _M_impl).super__Vector_impl_data._M_start[(long)puVar18];
      local_118.second = (unsigned_long)puVar18;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1d8,&local_118);
      }
      else {
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_118.first;
        (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = (unsigned_long)puVar18
        ;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      puVar18 = (pointer)((long)puVar18 + 1);
      puVar17 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ppVar19->first)->
                _M_impl).super__Vector_impl_data._M_start;
    } while (puVar18 < (pointer)((long)ppVar19->second - (long)puVar17 >> 3));
  }
  if (local_120 != local_188) {
    ppVar19 = (_Elt_pointer)((long)local_120 - (long)local_188);
    local_78 = (long)local_158 + ((long)local_160 - 1U);
    ppVar4 = (_Elt_pointer)0x0;
    local_120 = ppVar19;
    do {
      pcVar6 = (comm *)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar10 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_170 = (comm *)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_158 = (_Elt_pointer)((long)&ppVar4->first + (long)&local_188->first);
        local_160 = (_Elt_pointer)((long)local_158 * 0x10);
        ppVar8 = local_f8.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)local_158;
        uVar16 = (long)local_158 + local_150;
        local_180 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_178 = ppVar4;
        do {
          ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          if (ppVar19[-1].first <= ppVar8->first) break;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar2 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar2[0x1f].second] = uVar16;
            ppVar19 = ppVar2 + 0x20;
          }
          else {
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar16;
            ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar11 = ppVar19[-1].first;
          uVar15 = ppVar19[-1].second;
          while( true ) {
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
            ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            if (uVar11 != ppVar19[-1].first) break;
            ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar19[-1].second] = uVar15;
          }
        } while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
        ppVar19 = local_120;
        pcVar6 = local_170;
        ppVar10 = local_180;
        ppVar4 = local_178;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar5 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          if (*(unsigned_long *)
               ((long)&(local_f8.
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first + (long)local_160) ==
              ppVar5[-1].first) {
            ppVar5 = local_158;
            if (((_Elt_pointer)((long)&local_178->first + 1U) < local_120) &&
               (*(long *)((long)&(local_f8.
                                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->first +
                         (long)local_160) ==
                *(long *)((long)&local_f8.
                                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].first +
                         (long)local_160))) {
              ppVar8 = local_f8.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       (long)&local_178->first + (long)&local_188->first + 2;
              do {
                ppVar9 = ppVar4;
                ppVar5 = (_Elt_pointer)local_78;
                if (local_120 <= (_Elt_pointer)((long)&ppVar9->first + 2U)) goto LAB_00141873;
                ppVar2 = ppVar8 + -1;
                ppVar4 = (_Elt_pointer)((long)&ppVar9->first + 1);
                puVar3 = &ppVar8->first;
                ppVar8 = ppVar8 + 1;
              } while (ppVar2->first == *puVar3);
              ppVar5 = (_Elt_pointer)((long)&local_188->first + (long)&ppVar4->first);
LAB_00141873:
              ppVar4 = (_Elt_pointer)((long)&ppVar9->first + 1);
            }
            if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
              do {
                ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  ppVar9 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                }
                pcVar6 = local_170;
                ppVar10 = local_180;
                if (ppVar9[-1].first !=
                    local_f8.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)ppVar5].first) break;
                if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start
                  [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second] =
                       (long)ppVar5 + local_150;
                  operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first);
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
                }
                else {
                  (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start
                  [local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] =
                       (long)ppVar5 + local_150;
                  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
                }
                pcVar6 = local_170;
                ppVar10 = local_180;
              } while (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                       local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
            }
          }
        }
      }
    } while (((comm *)ppVar10 != pcVar6) &&
            (ppVar4 = (_Elt_pointer)((long)&ppVar4->first + 1), ppVar4 < ppVar19));
  }
  if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_180 = (_Elt_pointer)
                (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
    pppVar7 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar19 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVar4 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    do {
      puVar17 = (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pppVar24 = pppVar7;
      ppVar5 = ppVar19;
      ppVar10 = ppVar4;
      while( true ) {
        lVar12 = (long)ppVar10 - (long)ppVar5 >> 4;
        uVar31 = lVar12 - 1;
        if (uVar31 < 0x20) {
          ppVar9 = ppVar10 + -1;
        }
        else {
          uVar13 = uVar31 >> 5 | 0xf800000000000000;
          if (1 < lVar12) {
            uVar13 = uVar31 >> 5;
          }
          ppVar9 = pppVar24[uVar13] + uVar31 + uVar13 * -0x20;
        }
        if (ppVar9 == local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        ppVar9 = ppVar4;
        if (ppVar4 == ppVar19) {
          ppVar9 = pppVar7[-1] + 0x20;
        }
        if (uVar31 < 0x20) {
          ppVar30 = ppVar10 + -1;
          ppVar22 = ppVar5;
          pppVar29 = pppVar24;
        }
        else {
          uVar13 = uVar31 >> 5 | 0xf800000000000000;
          if (1 < lVar12) {
            uVar13 = uVar31 >> 5;
          }
          pppVar29 = pppVar24 + uVar13;
          ppVar22 = *pppVar29;
          ppVar30 = ppVar22 + uVar31 + uVar13 * -0x20;
        }
        if (ppVar30 == ppVar22) {
          ppVar30 = pppVar29[-1] + 0x20;
        }
        if (ppVar9[-1].first != ppVar30[-1].first) break;
        if (ppVar10 == ppVar5) {
          ppVar5 = pppVar24[-1];
          pppVar24 = pppVar24 + -1;
          ppVar10 = ppVar5 + 0x20;
        }
        ppVar9 = ppVar4;
        if (ppVar4 == ppVar19) {
          ppVar9 = pppVar7[-1] + 0x20;
        }
        ppVar10 = ppVar10 + -1;
        ppVar30 = ppVar10;
        if (ppVar10 == ppVar5) {
          ppVar30 = pppVar24[-1] + 0x20;
        }
        puVar17[ppVar30[-1].second] = ppVar9[-1].second;
      }
      if (ppVar4 == ppVar19) {
        ppVar4 = pppVar7[-1] + 0x20;
      }
      (&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180->first)->_M_impl
        ).super__Vector_impl_data._M_start)[ppVar4[-1].second] = local_108;
      if (ppVar10 == ppVar5) {
        ppVar5 = pppVar24[-1];
        pppVar24 = pppVar24 + -1;
        ppVar10 = ppVar5 + 0x20;
      }
      ppVar4 = ppVar10 + -1;
      pppVar7 = pppVar24;
      ppVar19 = ppVar5;
    } while (ppVar4 != local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_168,&local_f8);
  if (local_f8.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Deque_base(&local_1d8);
  return;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}